

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<char8_t> *specs,float_specs fspecs,locale_ref loc)

{
  significand_type *psVar1;
  uint uVar2;
  long lVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  size_t sVar14;
  char8_t decimal_point;
  char8_t zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char8_t> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_de [2];
  bool local_dc [4];
  bool local_d8 [4];
  sign_t local_d4;
  basic_format_specs<char8_t> *local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98;
  buffer<char8_t> *local_90;
  decimal_fp<double> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  int *local_48;
  int *local_40;
  char8_t *local_38;
  
  psVar1 = (significand_type *)fp->significand;
  lVar3 = 0x3f;
  if (((ulong)psVar1 | 1) != 0) {
    for (; ((ulong)psVar1 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  iVar10 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
           (uint)(psVar1 < *(significand_type **)
                            (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                            (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] * 8));
  local_de[1] = '0';
  uVar2 = fspecs._4_4_;
  local_d4 = uVar2 >> 8 & 0xff;
  local_d8 = (bool  [4])iVar10;
  local_c8._0_8_ = psVar1;
  local_80 = (undefined1  [8])fspecs;
  if (iVar10 < 0) {
LAB_00181d0c:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  uVar13 = (iVar10 + 1) - (uint)(local_d4 == none);
  uVar12 = (ulong)uVar13;
  local_de[0] = '.';
  local_78._0_4_ = local_d4;
  if ((uVar2 >> 0x11 & 1) != 0) {
    local_d0 = specs;
    local_c8._8_4_ = local_d4;
    local_90 = out.container;
    local_88 = fp;
    local_de[0] = fmt::v8::detail::decimal_point_impl<char>(loc);
    specs = local_d0;
    fp = local_88;
    out.container = local_90;
    local_78._0_4_ = local_c8._8_4_;
  }
  iVar5 = fp->exponent;
  local_c8._12_4_ = iVar10 + iVar5;
  iVar11 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00181a4b:
    iVar5 = iVar10 + iVar5 + -1;
    if ((uVar2 >> 0x14 & 1) == 0) {
      iVar6 = 0;
      if (iVar10 == 1) {
        local_de[0] = '\0';
        iVar6 = 0;
      }
    }
    else {
      iVar6 = 0;
      if (0 < iVar11 - iVar10) {
        iVar6 = iVar11 - iVar10;
      }
      uVar12 = (ulong)(uVar13 + iVar6);
    }
    local_78[0x14] = local_de[0];
    local_78._16_4_ = iVar10;
    local_60._0_5_ = CONCAT14('0',iVar6);
    local_60 = (decimal_fp<double> *)
               (CONCAT26(local_60._6_2_,
                         CONCAT15(((uVar2 >> 0x10 & 1) == 0) << 5,(undefined5)local_60)) |
               0x450000000000);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_58._4_4_,iVar5);
    local_78._8_8_ = psVar1;
    if (0 < specs->width) {
      if ((int)local_c8._12_4_ < 1) {
        iVar5 = 1 - local_c8._12_4_;
      }
      lVar3 = 2;
      if (99 < iVar5) {
        lVar3 = (ulong)(999 < iVar5) + 3;
      }
      sVar14 = uVar12 + (3 - (ulong)(local_de[0] == '\0')) + lVar3;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,sVar14,sVar14,(anon_class_40_8_dbbf3351 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar4.container;
    }
    bVar4 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
            ::anon_class_40_8_dbbf3351::operator()
                      ((anon_class_40_8_dbbf3351 *)local_78,out.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar4.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar6 = 0x10;
    if (0 < iVar11) {
      iVar6 = iVar11;
    }
    if (((int)local_c8._12_4_ < -3) || (iVar6 < (int)local_c8._12_4_)) goto LAB_00181a4b;
  }
  if (iVar5 < 0) {
    if ((int)local_c8._12_4_ < 1) {
      iVar5 = -local_c8._12_4_;
      local_b8._M_allocated_capacity._0_4_ = iVar5;
      if (SBORROW4(iVar11,iVar5) != iVar11 + local_c8._12_4_ < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar11;
      }
      if (iVar11 < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar5;
      }
      if (iVar10 != 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar5;
      }
      if (iVar10 == 0 && local_b8._M_allocated_capacity._0_4_ == 0) {
        local_dc[0] = (bool)(char)((uVar2 & 0x100000) >> 0x14);
        iVar10 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_dc[0] = true;
        iVar10 = 2;
        if ((int)local_b8._M_allocated_capacity._0_4_ < 0) goto LAB_00181d0c;
      }
      sVar14 = (uint)(iVar10 + local_b8._M_allocated_capacity._0_4_) + uVar12;
      local_78._0_8_ = local_de + 10;
      local_78._8_8_ = local_de + 1;
      local_78._16_8_ = local_de + 2;
      local_60 = (decimal_fp<double> *)local_de;
      local_58 = &local_b8;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8;
      local_48 = (int *)(local_de + 6);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_&>
                        (out,specs,sVar14,sVar14,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar4.container;
    }
    iVar5 = 0;
    local_dc = (bool  [4])(iVar11 - iVar10 & (int)(uVar2 << 0xb) >> 0x1f);
    uVar13 = (uint)local_dc;
    if ((int)local_dc < 1) {
      uVar13 = 0;
    }
    local_d0 = specs;
    digit_grouping<char8_t>::digit_grouping
              ((digit_grouping<char8_t> *)&local_b8,loc,(bool)((byte)(uVar2 >> 0x11) & 1));
    if (local_98 != '\0') {
      pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_);
      pcVar9 = pcVar8 + local_b8._8_8_;
      lVar3 = 0;
      do {
        if (pcVar8 == pcVar9) {
          cVar7 = pcVar9[-1];
          pcVar8 = pcVar9;
        }
        else {
          cVar7 = *pcVar8;
          if ((byte)(cVar7 + 0x81U) < 0x82) goto LAB_00181d2b;
          pcVar8 = pcVar8 + 1;
        }
        iVar5 = iVar5 + cVar7;
        if ((int)local_d8 <= iVar5) goto LAB_00181d2b;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00181d2b:
    sVar14 = uVar12 + uVar13 + 1 + lVar3;
    local_78._0_8_ = local_de + 10;
    local_78._8_8_ = local_c8;
    local_78._16_8_ = local_de + 6;
    local_60 = (decimal_fp<double> *)(local_c8 + 0xc);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_de;
    local_48 = (int *)(local_de + 2);
    local_40 = (int *)(local_de + 1);
    local_50 = &local_b8;
    bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_&>
                      (out,local_d0,sVar14,sVar14,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00181d83;
  }
  uVar12 = (ulong)(iVar5 + uVar13);
  local_dc = (bool  [4])(iVar11 - local_c8._12_4_);
  if ((uVar2 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_dc) {
      if ((int)local_dc < 1) goto LAB_00181c07;
    }
    else {
      local_dc[0] = true;
      local_dc[1] = false;
      local_dc[2] = false;
      local_dc[3] = false;
    }
    uVar12 = (uint)local_dc + uVar12 + 1;
  }
LAB_00181c07:
  digit_grouping<char8_t>::digit_grouping
            ((digit_grouping<char8_t> *)&local_b8,loc,(bool)((byte)(uVar2 >> 0x11) & 1));
  iVar10 = 0;
  if (local_98 != '\0') {
    pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                              local_b8._M_allocated_capacity._0_4_);
    pcVar9 = pcVar8 + local_b8._8_8_;
    lVar3 = 0;
    do {
      if (pcVar8 == pcVar9) {
        cVar7 = pcVar9[-1];
        pcVar8 = pcVar9;
      }
      else {
        cVar7 = *pcVar8;
        if ((byte)(cVar7 + 0x81U) < 0x82) goto LAB_00181c78;
        pcVar8 = pcVar8 + 1;
      }
      iVar10 = iVar10 + cVar7;
      if ((int)local_d8 <= iVar10) goto LAB_00181c78;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_00181c78:
  local_78._0_8_ = local_de + 10;
  local_78._8_8_ = local_c8;
  local_78._16_8_ = local_de + 6;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80;
  local_48 = (int *)local_de;
  local_40 = (int *)(local_de + 2);
  local_38 = local_de + 1;
  local_60 = fp;
  local_58 = &local_b8;
  bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_&>
                    (out,specs,uVar12 + lVar3,uVar12 + lVar3,(anon_class_72_9_d68ba176 *)local_78);
LAB_00181d83:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_allocated_capacity._4_4_,local_b8._M_allocated_capacity._0_4_) !=
      &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_),
                    local_a8._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}